

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O1

int multipleBordersNearby(double latDeg,double lonDeg,Territory territory)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined *puVar5;
  int iVar6;
  Territory territory_00;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  Point32 coord32;
  Point32 local_38;
  
  if (territory != TERRITORY_AAA && _TERRITORY_MIN < territory) {
    territory_00 = TERRITORY_NONE;
    if (0xfffffdea < (uint)(territory + ~TERRITORY_AAA)) {
      territory_00 = PARENT_NR[""[(uint)(territory + ~_TERRITORY_MIN)]];
    }
    if ((territory_00 != TERRITORY_NONE) &&
       (iVar4 = multipleBordersNearby(latDeg,lonDeg,territory_00), iVar4 != 0)) {
      return 1;
    }
    iVar4 = *(int *)("" + (long)territory * 4 + 0x28c);
    iVar6 = *(int *)("" + (long)territory * 4 + 0x290);
    lVar12 = (long)iVar6;
    convertCoordsToMicrosAndFractions(&local_38,(int *)0x0,(int *)0x0,latDeg,lonDeg);
    if (iVar4 < iVar6) {
      puVar5 = &DAT_00255e9c + lVar12 * 0x14;
      bVar2 = false;
      do {
        bVar3 = bVar2;
        if ((puVar5[1] & 2) == 0) {
          uVar1 = *(uint *)(puVar5 + -0xc);
          iVar6 = *(int *)(puVar5 + -4);
          uVar10 = uVar1;
          if ((int)uVar1 < 0) {
            iVar9 = 0x5a;
            if (iVar6 < 0) {
              uVar10 = -iVar6;
              goto LAB_001ce5c3;
            }
          }
          else {
LAB_001ce5c3:
            iVar8 = *(int *)(xDivider4_xdivider19 + (ulong)(uVar10 >> 0x13) * 4);
            iVar9 = iVar8 + 3;
            if (-1 < iVar8) {
              iVar9 = iVar8;
            }
            iVar9 = iVar9 >> 2;
          }
          if (local_38.latMicroDeg < iVar6 + 0x3c && (int)(uVar1 - 0x3c) <= local_38.latMicroDeg) {
            iVar11 = *(int *)(puVar5 + -0x10) - iVar9;
            iVar8 = *(int *)(puVar5 + -8) + iVar9;
            if ((local_38.lonMicroDeg < iVar11) || (iVar8 <= local_38.lonMicroDeg)) {
              iVar7 = local_38.lonMicroDeg + 360000000;
              if (iVar11 <= local_38.lonMicroDeg) {
                iVar7 = local_38.lonMicroDeg + -360000000;
              }
              if ((iVar7 < iVar11) || (iVar8 <= iVar7)) goto LAB_001ce6a2;
            }
            if (local_38.latMicroDeg < iVar6 + -0x3c && (int)(uVar1 + 0x3c) <= local_38.latMicroDeg)
            {
              iVar6 = *(int *)(puVar5 + -0x10) + iVar9;
              iVar9 = *(int *)(puVar5 + -8) - iVar9;
              if ((local_38.lonMicroDeg < iVar6) || (iVar9 <= local_38.lonMicroDeg)) {
                iVar8 = local_38.lonMicroDeg + 360000000;
                if (iVar6 <= local_38.lonMicroDeg) {
                  iVar8 = local_38.lonMicroDeg + -360000000;
                }
                if ((iVar8 < iVar6) || (iVar9 <= iVar8)) goto LAB_001ce695;
              }
            }
            else {
LAB_001ce695:
              bVar3 = true;
              if (bVar2) {
                return 1;
              }
            }
          }
        }
LAB_001ce6a2:
        bVar2 = bVar3;
        lVar12 = lVar12 + -1;
        puVar5 = puVar5 + -0x14;
      } while (iVar4 < lVar12);
    }
  }
  return 0;
}

Assistant:

int multipleBordersNearby(double latDeg, double lonDeg, enum Territory territory) {
    const enum Territory ccode = territory;
    if ((ccode > _TERRITORY_MIN) && (ccode != TERRITORY_AAA)) { // valid territory, not earth
        const enum Territory parentTerritoryCode = getParentCountryOf(territory);
        if (parentTerritoryCode != TERRITORY_NONE) {
            // there is a parent! check its borders as well...
            if (multipleBordersNearby(latDeg, lonDeg, parentTerritoryCode)) {
                return 1;
            }
        }
        {
            int m;
            int nrFound = 0;
            const int from = firstRec(ccode);
            const int upto = lastRec(ccode);
            Point32 coord32;
            convertCoordsToMicrosAndFractions(&coord32, NULL, NULL, latDeg, lonDeg);
            for (m = upto; m >= from; m--) {
                if (!IS_RESTRICTED(m)) {
                    if (isNearBorderOf(&coord32, TERRITORY_BOUNDARY(m))) {
                        nrFound++;
                        if (nrFound > 1) {
                            return 1;
                        }
                    }
                }
            }
        }
    }
    return 0;
}